

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-textblock.c
# Opt level: O3

void textblock_vappend_c(textblock *tb,uint8_t attr,char *fmt,__va_list_tag *vp)

{
  char *buf;
  size_t sVar1;
  size_t sVar2;
  ulong uVar3;
  uint uVar4;
  va_list args;
  __va_list_tag local_48;
  
  buf = (char *)mem_zalloc(0x80);
  local_48.reg_save_area = vp->reg_save_area;
  local_48.gp_offset = vp->gp_offset;
  local_48.fp_offset = vp->fp_offset;
  local_48.overflow_arg_area = vp->overflow_arg_area;
  sVar1 = vstrnfmt(buf,0x80,fmt,&local_48);
  if (0x7e < sVar1) {
    sVar1 = 0x100;
    do {
      buf = (char *)mem_realloc(buf,sVar1);
      local_48.reg_save_area = vp->reg_save_area;
      local_48.gp_offset = vp->gp_offset;
      local_48.fp_offset = vp->fp_offset;
      local_48.overflow_arg_area = vp->overflow_arg_area;
      sVar2 = vstrnfmt(buf,sVar1,fmt,&local_48);
      uVar3 = sVar1 - 1;
      sVar1 = sVar1 + 0x80;
    } while (uVar3 <= sVar2);
  }
  sVar1 = text_mbstowcs((wchar_t *)0x0,buf,L'\0');
  uVar4 = (uint)sVar1;
  if (-1 < (int)uVar4) {
    textblock_resize_if_needed(tb,(ulong)(uVar4 + 1));
    text_mbstowcs(tb->text + tb->strlen,buf,(int)tb->size - (int)tb->strlen);
    memset(tb->attrs + tb->strlen,(uint)attr,(ulong)(uVar4 & 0x7fffffff));
    tb->strlen = tb->strlen + (ulong)(uVar4 & 0x7fffffff);
    mem_free(buf);
    return;
  }
  __assert_fail("new_length >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/z-textblock.c"
                ,0x7e,
                "void textblock_vappend_c(textblock *, uint8_t, const char *, struct __va_list_tag *)"
               );
}

Assistant:

static void textblock_vappend_c(textblock *tb, uint8_t attr, const char *fmt,
		va_list vp)
{
	size_t temp_len = TEXTBLOCK_LEN_INITIAL;
	char *temp_space = mem_zalloc(temp_len);
	int new_length;

	/* We have to format the incoming string in native (external) format
	 * re-allocating the temporary space as necessary. Once it's been
	 * successfully formatted, we can then do the conversion to wide chars
	 */
	while (1) {
		va_list args;
		size_t len;

		va_copy(args, vp);
		len = vstrnfmt(temp_space, temp_len, fmt, args);
		va_end(args);
		if (len < temp_len - 1) {
			/* Not using all space, therefore it completed */
			break;
		}

		temp_len = TEXTBLOCK_LEN_INCR(temp_len);
		temp_space = mem_realloc(temp_space, temp_len * sizeof *temp_space);
	}

	/* Get extent of addition in wide chars */
	new_length = text_mbstowcs(NULL, temp_space, 0);
	assert(new_length >= 0); /* If this fails, the string was badly formed */
	textblock_resize_if_needed(tb, new_length + 1);

	/* Convert to wide chars, into the text block buffer */
	text_mbstowcs(tb->text + tb->strlen, temp_space, tb->size - tb->strlen);
	memset(tb->attrs + tb->strlen, attr, new_length);
	tb->strlen += new_length;
	mem_free(temp_space);
}